

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void ImageAlphaMask(Image *image,Image alphaMask)

{
  Image image_00;
  Image image_01;
  undefined1 auVar1 [16];
  void *pvVar2;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb6;
  bool bVar3;
  undefined1 in_stack_ffffffffffffffb7;
  int local_40;
  int local_3c;
  int k_1;
  int i_1;
  int k;
  int i;
  uchar *data;
  Image mask;
  Image *image_local;
  
  mask._16_8_ = image;
  if ((image->width == alphaMask.width) && (image->height == alphaMask.height)) {
    if (image->format < 0xb) {
      auVar1 = alphaMask._8_16_;
      image_00._16_6_ = in_stack_ffffffffffffffb0;
      image_00.data = (void *)auVar1._0_8_;
      image_00.width = auVar1._8_4_;
      image_00.height = auVar1._12_4_;
      image_00.format._2_1_ = in_stack_ffffffffffffffb6;
      image_00.format._3_1_ = in_stack_ffffffffffffffb7;
      ImageCopy(image_00);
      if (mask.height != 1) {
        ImageFormat((Image *)&data,1);
      }
      if (*(int *)(mask._16_8_ + 0x14) == 1) {
        pvVar2 = malloc((long)(*(int *)(mask._16_8_ + 8) * *(int *)(mask._16_8_ + 0xc) * 2));
        i_1 = 0;
        k_1 = 0;
        while( true ) {
          in_stack_ffffffffffffffb7 = true;
          if ((int)mask.data * mask.data._4_4_ <= i_1) {
            in_stack_ffffffffffffffb7 =
                 i_1 < *(int *)(mask._16_8_ + 8) * *(int *)(mask._16_8_ + 0xc);
          }
          if ((bool)in_stack_ffffffffffffffb7 == false) break;
          *(undefined1 *)((long)pvVar2 + (long)k_1) =
               *(undefined1 *)(*(long *)mask._16_8_ + (long)i_1);
          *(uchar *)((long)pvVar2 + (long)(k_1 + 1)) = data[i_1];
          i_1 = i_1 + 1;
          k_1 = k_1 + 2;
        }
        free(*(void **)mask._16_8_);
        *(void **)mask._16_8_ = pvVar2;
        *(undefined4 *)(mask._16_8_ + 0x14) = 2;
      }
      else {
        if (*(int *)(mask._16_8_ + 0x14) != 7) {
          ImageFormat((Image *)mask._16_8_,7);
        }
        local_3c = 0;
        local_40 = 3;
        while( true ) {
          bVar3 = true;
          if ((int)mask.data * mask.data._4_4_ <= local_3c) {
            bVar3 = local_3c < *(int *)(mask._16_8_ + 8) * *(int *)(mask._16_8_ + 0xc);
          }
          if (!bVar3) break;
          *(uchar *)(*(long *)mask._16_8_ + (long)local_40) = data[local_3c];
          local_3c = local_3c + 1;
          local_40 = local_40 + 4;
        }
        in_stack_ffffffffffffffb6 = 0;
      }
      image_01.data._4_4_ = mask.data._4_4_;
      image_01.data._0_4_ = (int)mask.data;
      image_01.height = mask.height;
      image_01.width = mask.width;
      image_01._16_6_ = in_stack_ffffffffffffffb0;
      image_01.format._2_1_ = in_stack_ffffffffffffffb6;
      image_01.format._3_1_ = in_stack_ffffffffffffffb7;
      UnloadImage(image_01);
    }
    else {
      TraceLog(4,"IMAGE: Alpha mask can not be applied to compressed data formats");
    }
  }
  else {
    TraceLog(4,"IMAGE: Alpha mask must be same size as image");
  }
  return;
}

Assistant:

void ImageAlphaMask(Image *image, Image alphaMask)
{
    if ((image->width != alphaMask.width) || (image->height != alphaMask.height))
    {
        TRACELOG(LOG_WARNING, "IMAGE: Alpha mask must be same size as image");
    }
    else if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB)
    {
        TRACELOG(LOG_WARNING, "IMAGE: Alpha mask can not be applied to compressed data formats");
    }
    else
    {
        // Force mask to be Grayscale
        Image mask = ImageCopy(alphaMask);
        if (mask.format != PIXELFORMAT_UNCOMPRESSED_GRAYSCALE) ImageFormat(&mask, PIXELFORMAT_UNCOMPRESSED_GRAYSCALE);

        // In case image is only grayscale, we just add alpha channel
        if (image->format == PIXELFORMAT_UNCOMPRESSED_GRAYSCALE)
        {
            unsigned char *data = (unsigned char *)RL_MALLOC(image->width*image->height*2);

            // Apply alpha mask to alpha channel
            for (int i = 0, k = 0; (i < mask.width*mask.height) || (i < image->width*image->height); i++, k += 2)
            {
                data[k] = ((unsigned char *)image->data)[i];
                data[k + 1] = ((unsigned char *)mask.data)[i];
            }

            RL_FREE(image->data);
            image->data = data;
            image->format = PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA;
        }
        else
        {
            // Convert image to RGBA
            if (image->format != PIXELFORMAT_UNCOMPRESSED_R8G8B8A8) ImageFormat(image, PIXELFORMAT_UNCOMPRESSED_R8G8B8A8);

            // Apply alpha mask to alpha channel
            for (int i = 0, k = 3; (i < mask.width*mask.height) || (i < image->width*image->height); i++, k += 4)
            {
                ((unsigned char *)image->data)[k] = ((unsigned char *)mask.data)[i];
            }
        }

        UnloadImage(mask);
    }
}